

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O1

void qrfac(double *A,int M,int N,int lda,int pivot,int *ipvt,int lipvt,double *rdiag,double *acnorm,
          double eps)

{
  size_t __size;
  ulong uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  double *col;
  void *__ptr;
  double *x;
  ulong uVar5;
  long lVar6;
  double *pdVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  double *pdVar15;
  int iVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double *local_c0;
  ulong local_b8;
  long local_b0;
  int local_44;
  ulong local_38;
  
  if (1 < (uint)pivot) {
    puts("Pivot only takes binary values 0 and 1 ");
    exit(-1);
  }
  lVar13 = (long)N;
  __size = lVar13 * 8;
  lVar17 = (long)M;
  col = (double *)malloc(__size * lVar17);
  __ptr = malloc(__size);
  x = (double *)malloc(lVar17 * 8);
  mtranspose(A,M,N,col);
  uVar1 = (ulong)(uint)N;
  if (0 < N) {
    uVar14 = 0;
    pdVar15 = col;
    do {
      dVar18 = enorm(pdVar15,M);
      acnorm[uVar14] = dVar18;
      rdiag[uVar14] = dVar18;
      *(double *)((long)__ptr + uVar14 * 8) = dVar18;
      if (pivot == 1) {
        ipvt[uVar14] = (int)uVar14;
      }
      uVar14 = uVar14 + 1;
      pdVar15 = pdVar15 + lVar17;
    } while (uVar1 != uVar14);
  }
  uVar2 = N;
  if (M < N) {
    uVar2 = M;
  }
  if (0 < (int)uVar2) {
    local_c0 = A + 1;
    uVar12 = M - 1;
    local_b8 = 1;
    iVar4 = 0;
    local_b0 = 0;
    local_38 = 0;
    uVar14 = (ulong)(uint)M;
    pdVar15 = A;
    local_44 = N + 1;
    do {
      if (pivot == 1) {
        uVar8 = local_38 & 0xffffffff;
        uVar5 = local_38;
        do {
          uVar9 = (uint)uVar5;
          if (rdiag[uVar5] < rdiag[(int)(uint)uVar8] || rdiag[uVar5] == rdiag[(int)(uint)uVar8]) {
            uVar9 = (uint)uVar8;
          }
          uVar5 = uVar5 + 1;
          uVar8 = (ulong)uVar9;
        } while (uVar1 != uVar5);
        if (local_38 != uVar9) {
          lVar6 = (long)(int)uVar9;
          uVar5 = (ulong)(uint)M;
          pdVar7 = A;
          do {
            dVar18 = *(double *)((long)pdVar7 + local_b0);
            *(double *)((long)pdVar7 + local_b0) = pdVar7[lVar6];
            pdVar7[lVar6] = dVar18;
            pdVar7 = pdVar7 + lVar13;
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
          rdiag[lVar6] = rdiag[local_38];
          *(undefined8 *)((long)__ptr + lVar6 * 8) = *(undefined8 *)((long)__ptr + local_38 * 8);
          iVar16 = ipvt[local_38];
          ipvt[local_38] = ipvt[lVar6];
          ipvt[lVar6] = iVar16;
        }
      }
      lVar6 = lVar17 - local_38;
      if (lVar6 != 0 && (long)local_38 <= lVar17) {
        pdVar7 = A + (long)iVar4 + local_38;
        uVar5 = 0;
        do {
          x[uVar5] = *pdVar7;
          uVar5 = uVar5 + 1;
          pdVar7 = pdVar7 + lVar13;
        } while ((uVar14 & 0xffffffff) != uVar5);
      }
      dVar18 = enorm(x,(int)lVar6);
      if ((dVar18 != 0.0) || (NAN(dVar18))) {
        lVar10 = (long)((int)local_38 * N) + local_38;
        dVar18 = (double)(~-(ulong)(A[lVar10] < 0.0) & (ulong)dVar18 |
                         (ulong)-dVar18 & -(ulong)(A[lVar10] < 0.0));
        uVar5 = uVar14;
        pdVar7 = pdVar15;
        do {
          *pdVar7 = *pdVar7 / dVar18;
          pdVar7 = pdVar7 + lVar13;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
        A[lVar10] = A[lVar10] + 1.0;
        if (((long)local_38 <= lVar13 + -2) && ((long)(local_38 + 1) < lVar13)) {
          pdVar7 = local_c0;
          uVar5 = local_b8;
          iVar16 = local_44;
          do {
            dVar19 = 0.0;
            lVar11 = 0;
            uVar8 = uVar14;
            do {
              dVar19 = dVar19 + *(double *)((long)pdVar15 + lVar11) *
                                *(double *)((long)pdVar7 + lVar11);
              lVar11 = lVar11 + __size;
              uVar8 = uVar8 - 1;
            } while (uVar8 != 0);
            dVar20 = A[lVar10];
            lVar11 = 0;
            uVar8 = uVar14;
            do {
              *(double *)((long)pdVar7 + lVar11) =
                   *(double *)((long)pdVar15 + lVar11) * (-dVar19 / dVar20) +
                   *(double *)((long)pdVar7 + lVar11);
              lVar11 = lVar11 + __size;
              uVar8 = uVar8 - 1;
            } while (uVar8 != 0);
            if (pivot == 1) {
              dVar19 = rdiag[uVar5];
              if ((dVar19 != 0.0) || (NAN(dVar19))) {
                dVar20 = pmax(0.0,1.0 - (A[local_38 * lVar13 + uVar5] / dVar19) *
                                        (A[local_38 * lVar13 + uVar5] / dVar19));
                dVar19 = rdiag[uVar5];
                if (dVar20 < 0.0) {
                  dVar20 = sqrt(dVar20);
                }
                else {
                  dVar20 = SQRT(dVar20);
                }
                rdiag[uVar5] = dVar19 * dVar20;
                dVar19 = ((dVar19 * dVar20) / *(double *)((long)__ptr + uVar5 * 8)) * 0.05;
                if (dVar19 * dVar19 <= eps) {
                  if (1 < lVar6) {
                    uVar8 = 0;
                    iVar3 = iVar16;
                    do {
                      x[uVar8] = A[iVar3];
                      uVar8 = uVar8 + 1;
                      iVar3 = iVar3 + N;
                    } while (uVar12 != uVar8);
                  }
                  dVar19 = enorm(x,(int)lVar6 + -1);
                  rdiag[uVar5] = dVar19;
                  *(double *)((long)__ptr + uVar5 * 8) = dVar19;
                }
              }
            }
            uVar5 = uVar5 + 1;
            pdVar7 = pdVar7 + 1;
            iVar16 = iVar16 + 1;
          } while (uVar5 != uVar1);
        }
      }
      uVar14 = uVar14 - 1;
      rdiag[local_38] = -dVar18;
      local_38 = local_38 + 1;
      local_b8 = local_b8 + 1;
      local_b0 = local_b0 + 8;
      iVar4 = iVar4 + N;
      pdVar15 = pdVar15 + lVar13 + 1;
      local_c0 = local_c0 + lVar13 + 1;
      local_44 = local_44 + N + 1;
      uVar12 = uVar12 - 1;
    } while (local_38 != uVar2);
  }
  free(col);
  free(__ptr);
  free(x);
  return;
}

Assistant:

void qrfac(double *A, int M, int N, int lda, int pivot, int *ipvt, int lipvt,double *rdiag, double *acnorm,double eps) {
	int i,j,jp1,k,kmax,minmn,t;
    double ajnorm,epsmch,one,p05,sum,temp,zero,temp2,pmaxval;
    double *AT,*wa,*wa2;

 /*
     * This routine is a C translation of Fortran Code by
     *     argonne national laboratory. minpack project. march 1980.
      burton s. garbow, kenneth e. hillstrom, jorge j. more
     *
     * M is a positive integer input variable set to the number
         of rows of a.

       N is a positive integer input variable set to the number
         of columns of a.

       A is an M by N array. on input a contains the matrix for
         which the qr factorization is to be computed. on output
         the strict upper trapezoidal part of a contains the strict
         upper trapezoidal part of r, and the lower trapezoidal
         part of a contains a factored form of q (the non-trivial
         elements of the u vectors described above).

       lda is a positive integer input variable not less than m
         which specifies the leading dimension of the array a.

       pivot is an integer input variable. if pivot is set to 1,
         then column pivoting is enforced. if pivot is set to 0,
         then no column pivoting is done.

       ipvt is an integer output array of length lipvt. ipvt
         defines the permutation matrix p such that a*p = q*r.
         column j of p is column ipvt(j) of the identity matrix.
         if pivot is false, ipvt is not referenced.

       lipvt is a positive integer input variable. if pivot is false,
         then lipvt may be as small as 1. if pivot is true, then
         lipvt must be at least n.

       rdiag is an output array of length N which contains the
         diagonal elements of r.

       acnorm is an output array of length N which contains the
         norms of the corresponding columns of the input matrix a.
         if this information is not needed, then acnorm can coincide
         with rdiag.
     *
     */


    if (pivot != 0 && pivot != 1) {
    	printf("Pivot only takes binary values 0 and 1 \n");
    	exit(-1);
    }

    AT = (double*) malloc(sizeof(double) *N*M);
    wa = (double*) malloc(sizeof(double) *N);
    wa2 = (double*) malloc(sizeof(double) *M);

    one = 1.0; zero = 0.0; p05 = 5.0e-02;
    epsmch = eps;

    mtranspose(A,M,N,AT);// AT is size NXM

    //compute the initial column norms and initialize several arrays.

    for(j = 0; j < N;++j) {
    	acnorm[j] = enorm(AT+j*M,M);
    	rdiag[j] = acnorm[j];
    	wa[j] = rdiag[j];
    	if (pivot == 1) {
    		ipvt[j] = j;
    	}
    }

    //reduce a to r with householder transformations.

    if (M < N) {
    	minmn = M;
    } else {
    	minmn = N;
    }

    for (j = 0; j < minmn;++j) {
    	if (pivot == 1) {
    		//bring the column of largest norm into the pivot position.
    		kmax = j;
    		for(k = j; k < N;++k) {
    			if (rdiag[k] > rdiag[kmax]) {
    				kmax = k;
    			}
    		}
			if (kmax != j) {
				for(i = 0; i < M;++i) {
					t = i * N;
					temp = A[t+j];
					A[t+j] = A[t+kmax];
					A[t+kmax] = temp;
				}
				rdiag[kmax] = rdiag[j];
				wa[kmax] = wa[j];
				k = ipvt[j];
				ipvt[j] = ipvt[kmax];
				ipvt[kmax] = k;
			}
    	}
    	//        compute the householder transformation to reduce the
    	//       j-th column of a to a multiple of the j-th unit vector.
    	t = j * N + j;

    	for(i = 0; i < M-j;++i) {
    		wa2[i] = A[t+i*N];
    	}
    	ajnorm = enorm(wa2,M-j);
    	if (ajnorm != zero) {
    		if (A[t] < zero) {
    			ajnorm = - ajnorm;
    		}
    		for(i = j; i < M;++i) {
    			A[i*N+j] /= ajnorm;
    		}
    		A[t] += one;
    		//        apply the transformation to the remaining columns
    		//        and update the norms.

    		jp1 = j + 1; // Breakpoint
    		if (N >= jp1+1) {
    			for(k = jp1; k < N;++k) {
    				sum = zero;
    				for(i = j; i < M;++i) {
    					sum += (A[i*N+j] * A[i*N+k]);
    				}
    				temp = sum / A[t];
    				for(i = j; i < M;++i) {
    					A[i*N+k] -= (temp * A[i*N+j]);
    				}
    				// Breakpoint 2
    				if (pivot == 1 && rdiag[k] != zero) {
    					temp = A[j*N+k] / rdiag[k];
						pmaxval = pmax(zero, one - temp*temp);
    					rdiag[k] = rdiag[k]*sqrt(pmaxval);
    					temp2 = (p05*(rdiag[k]/wa[k]));
    					temp2 = temp2 * temp2;
    					if (temp2 <= epsmch) {
    				    	for(i = 0; i < M-j-1;++i) {
    				    		wa2[i] = A[jp1*N+k+i*N];
    				    	}
    				    	rdiag[k] = enorm(wa2,M-j-1);
    				    	wa[k] = rdiag[k];
    					}
    				}
    			}
    		}
    	}
    	rdiag[j] = -ajnorm;
    }

    free(AT);
    free(wa);
    free(wa2);
}